

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O0

void __thiscall SubExpr::print(SubExpr *this)

{
  Token local_80;
  SubExpr *local_10;
  SubExpr *this_local;
  
  local_10 = this;
  ExprNode::token(&local_80,&this->super_ExprNode);
  Token::print(&local_80);
  Token::~Token(&local_80);
  std::operator<<((ostream *)&std::cout,'[');
  (**this->_test->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout,']');
  return;
}

Assistant:

void SubExpr::print() {
    token().print();
    std::cout << '[';
    _test->print();//index
    std::cout << ']';
}